

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FieldDescriptor FVar1;
  undefined1 *puVar2;
  long lVar3;
  string *input;
  bool bVar4;
  Type TVar5;
  Descriptor *pDVar6;
  ErrorLocation location;
  char *error;
  string local_50;
  
  if (this->pool_->lazily_build_dependencies_ == true) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    pDVar6 = FieldDescriptor::message_type(field);
    if (pDVar6 == (Descriptor *)0x0) {
      return;
    }
  }
  if ((*(char *)(*(long *)(field + 0x38) + 0x4d) == '\x01') &&
     (TVar5 = FieldDescriptor::type(field), TVar5 != TYPE_MESSAGE)) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "[lazy = true] can only be specified for submessage fields.");
  }
  if ((*(char *)(*(long *)(field + 0x38) + 0x4c) == '\x01') &&
     (bVar4 = FieldDescriptor::is_packable(field), !bVar4)) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "[packed = true] can only be specified for repeated primitive fields.");
  }
  if (((*(long *)(field + 0x20) != 0) &&
      (puVar2 = *(undefined1 **)(*(long *)(field + 0x20) + 0x20),
      puVar2 != _MessageOptions_default_instance_)) && (puVar2[0x48] == '\x01')) {
    if (((byte)field[1] & 8) == 0) {
      lVar3 = *(long *)(field + 8);
      error = "MessageSets cannot have fields, only extensions.";
      location = NAME;
    }
    else {
      if ((((byte)field[1] & 0x60) == 0x20) &&
         (TVar5 = FieldDescriptor::type(field), TVar5 == TYPE_MESSAGE)) goto LAB_003689e0;
      lVar3 = *(long *)(field + 8);
      error = "Extensions of MessageSets must be optional messages.";
      location = TYPE;
    }
    AddError(this,(string *)(lVar3 + 0x20),&proto->super_Message,location,error);
  }
LAB_003689e0:
  if ((((*(long *)(field + 0x10) != 0) &&
       (puVar2 = *(undefined1 **)(*(long *)(field + 0x10) + 0x78),
       puVar2 != _FileOptions_default_instance_)) &&
      ((*(int *)(puVar2 + 0xa0) == 3 && (*(long *)(field + 0x20) != 0)))) &&
     (((lVar3 = *(long *)(*(long *)(field + 0x20) + 0x10), lVar3 == 0 ||
       (puVar2 = *(undefined1 **)(lVar3 + 0x78), puVar2 == _FileOptions_default_instance_)) ||
      (*(int *)(puVar2 + 0xa0) != 3)))) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
            );
  }
  bVar4 = FieldDescriptor::is_map(field);
  if ((bVar4) && (bVar4 = ValidateMapEntry(this,field,proto), !bVar4)) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
  }
  ValidateJSType(this,field,proto);
  if ((~(byte)field[1] & 0xc) == 0) {
    input = *(string **)(field + 8);
    FVar1 = field[3];
    anon_unknown_1::ToJsonName(&local_50,input);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(input->_M_dataplus)._M_p + (ulong)((byte)FVar1 & 0x70) * 2),
                            &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar4) {
      AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,OPTION_NAME,
               "option json_name is not allowed on extension fields.");
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }
  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (calculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // an user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

}